

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

string * __thiscall miniros::Subscription::md5sum_abi_cxx11_(Subscription *this)

{
  long in_RSI;
  string *in_RDI;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  string *psVar1;
  
  psVar1 = in_RDI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x60));
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d3402);
  return psVar1;
}

Assistant:

const std::string Subscription::md5sum()
{
  std::scoped_lock<std::mutex> lock(md5sum_mutex_);
  return md5sum_;
}